

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_solver.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> *
lu::solve(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         *A,vector<double,_std::allocator<double>_> *b)

{
  int *piVar1;
  size_t __size;
  undefined4 uVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer pdVar5;
  pointer pdVar6;
  undefined8 uVar7;
  iterator __position;
  bool bVar8;
  undefined1 auVar9 [16];
  long lVar10;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  double *__ptr_02;
  void *pvVar11;
  ulong uVar12;
  int i;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  double *pdVar16;
  ulong uVar17;
  ulong uVar18;
  size_t j;
  long lVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  size_type __n;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  
  pvVar3 = (A->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (A->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar10 = (long)pvVar4 - (long)pvVar3 >> 3;
  __n = lVar10 * -0x5555555555555555;
  __size = lVar10 * 0x5555555555555558;
  __ptr = malloc(__size);
  __ptr_00 = malloc(__size);
  __ptr_01 = malloc(lVar10 * -0x5555555555555554 + 4);
  __ptr_02 = (double *)malloc(__size);
  if (pvVar4 != pvVar3) {
    lVar10 = 0;
    do {
      pvVar11 = malloc(__size);
      *(void **)((long)__ptr + lVar10 * 8) = pvVar11;
      lVar10 = lVar10 + 1;
    } while (__n + (__n == 0) != lVar10);
    if (pvVar4 != pvVar3) {
      pdVar5 = (b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = __n + (__n == 0);
      lVar15 = 0;
      do {
        pdVar6 = pvVar3[lVar15].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar21 = *(long *)((long)__ptr + lVar15 * 8);
        lVar19 = 0;
        do {
          *(double *)(lVar21 + lVar19 * 8) = pdVar6[lVar19];
          lVar19 = lVar19 + 1;
        } while (lVar10 != lVar19);
        *(double *)((long)__ptr_00 + lVar15 * 8) = pdVar5[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 != lVar10);
    }
  }
  auVar9 = _DAT_00108510;
  uVar22 = (uint)__n;
  if (-1 < (int)uVar22) {
    lVar10 = (ulong)(uVar22 + 1) - 1;
    auVar24._8_4_ = (int)lVar10;
    auVar24._0_8_ = lVar10;
    auVar24._12_4_ = (int)((ulong)lVar10 >> 0x20);
    uVar13 = 0;
    auVar24 = auVar24 ^ _DAT_00108510;
    auVar25 = _DAT_00108670;
    do {
      auVar27 = auVar25 ^ auVar9;
      if ((bool)(~(auVar27._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar27._0_4_ ||
                  auVar24._4_4_ < auVar27._4_4_) & 1)) {
        *(int *)((long)__ptr_01 + uVar13 * 4) = (int)uVar13;
      }
      if ((auVar27._12_4_ != auVar24._12_4_ || auVar27._8_4_ <= auVar24._8_4_) &&
          auVar27._12_4_ <= auVar24._12_4_) {
        *(int *)((long)__ptr_01 + uVar13 * 4 + 4) = (int)uVar13 + 1;
      }
      uVar13 = uVar13 + 2;
      lVar10 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 2;
      auVar25._8_8_ = lVar10 + 2;
    } while (((ulong)(uVar22 + 1) + 1 & 0xfffffffffffffffe) != uVar13);
    if (uVar22 != 0) {
      uVar12 = (ulong)(uVar22 & 0x7fffffff);
      uVar14 = 1;
      uVar13 = 0;
      do {
        uVar17 = uVar13;
        uVar18 = uVar13;
        dVar23 = 0.0;
        do {
          dVar26 = ABS(*(double *)(*(long *)((long)__ptr + uVar18 * 8) + uVar13 * 8));
          uVar20 = uVar17;
          if (dVar23 < dVar26) {
            uVar20 = uVar18;
          }
          uVar17 = uVar20 & 0xffffffff;
          if (dVar26 <= dVar23) {
            dVar26 = dVar23;
          }
          uVar18 = uVar18 + 1;
          dVar23 = dVar26;
        } while (uVar12 != uVar18);
        if (dVar26 < 0.0) break;
        if (uVar13 != (uVar20 & 0xffffffff)) {
          uVar2 = *(undefined4 *)((long)__ptr_01 + uVar13 * 4);
          lVar10 = (long)(int)uVar20;
          *(undefined4 *)((long)__ptr_01 + uVar13 * 4) =
               *(undefined4 *)((long)__ptr_01 + lVar10 * 4);
          *(undefined4 *)((long)__ptr_01 + lVar10 * 4) = uVar2;
          uVar7 = *(undefined8 *)((long)__ptr + uVar13 * 8);
          *(undefined8 *)((long)__ptr + uVar13 * 8) = *(undefined8 *)((long)__ptr + lVar10 * 8);
          *(undefined8 *)((long)__ptr + lVar10 * 8) = uVar7;
          piVar1 = (int *)((long)__ptr_01 + uVar12 * 4);
          *piVar1 = *piVar1 + 1;
        }
        uVar17 = uVar13 + 1;
        if (uVar17 < uVar12) {
          lVar10 = *(long *)((long)__ptr + uVar13 * 8);
          uVar18 = uVar14;
          do {
            lVar15 = *(long *)((long)__ptr + uVar18 * 8);
            *(double *)(lVar15 + uVar13 * 8) =
                 *(double *)(lVar15 + uVar13 * 8) / *(double *)(lVar10 + uVar13 * 8);
            uVar20 = uVar14;
            do {
              *(double *)(lVar15 + uVar20 * 8) =
                   *(double *)(lVar15 + uVar20 * 8) -
                   *(double *)(lVar15 + uVar13 * 8) * *(double *)(lVar10 + uVar20 * 8);
              uVar20 = uVar20 + 1;
            } while (uVar12 != uVar20);
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar12);
        }
        uVar14 = uVar14 + 1;
        uVar13 = uVar17;
      } while (uVar17 != uVar12);
      uVar13 = 0;
      do {
        dVar23 = *(double *)((long)__ptr_00 + (long)*(int *)((long)__ptr_01 + uVar13 * 4) * 8);
        __ptr_02[uVar13] = dVar23;
        if (uVar13 != 0) {
          lVar10 = *(long *)((long)__ptr + uVar13 * 8);
          uVar14 = 0;
          do {
            dVar23 = dVar23 - *(double *)(lVar10 + uVar14 * 8) * __ptr_02[uVar14];
            __ptr_02[uVar13] = dVar23;
            uVar14 = uVar14 + 1;
          } while (uVar13 != uVar14);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar12);
      lVar10 = uVar12 * 8;
      pdVar16 = __ptr_02 + uVar12;
      uVar13 = uVar12;
      do {
        uVar14 = uVar13 - 1;
        lVar15 = *(long *)((long)__ptr + uVar13 * 8 + -8);
        dVar23 = __ptr_02[uVar13 - 1];
        if ((long)uVar13 < (long)uVar12) {
          lVar21 = 0;
          do {
            dVar23 = dVar23 - *(double *)(lVar15 + lVar10 + lVar21 * 8) * pdVar16[lVar21];
            __ptr_02[uVar14] = dVar23;
            lVar21 = lVar21 + 1;
          } while ((int)uVar13 + (int)lVar21 < (int)uVar22);
        }
        __ptr_02[uVar14] = dVar23 / *(double *)(lVar15 + uVar14 * 8);
        pdVar16 = pdVar16 + -1;
        lVar10 = lVar10 + -8;
        bVar8 = 1 < (long)uVar13;
        uVar13 = uVar14;
      } while (bVar8);
    }
  }
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::reserve(__return_storage_ptr__,__n);
  if (pvVar4 != pvVar3) {
    lVar10 = 0;
    pdVar16 = __ptr_02;
    do {
      free(*(void **)((long)__ptr + lVar10 * 8));
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)__return_storage_ptr__,__position,
                   pdVar16);
      }
      else {
        *__position._M_current = *pdVar16;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar10 = lVar10 + 1;
      pdVar16 = pdVar16 + 1;
    } while (__n + (__n == 0) != lVar10);
  }
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  free(__ptr_02);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> solve(const std::vector<std::vector<double>> &A, const std::vector<double> &b)
{
    size_t N = A.size();
    double **A_matr = static_cast<double **>(malloc(N * sizeof(double *)));
    double *b_vec = static_cast<double *>(malloc(N * sizeof(double)));
    int *P = static_cast<int *>(malloc((N + 1) * sizeof(int)));
    double *res = static_cast<double *>(malloc(N * sizeof(double)));

    for (size_t i = 0; i < N; ++i)
    {
        A_matr[i] = static_cast<double *>(malloc(N * sizeof(double)));
    }
    for (size_t i = 0; i < N; ++i)
    {
        for (size_t j = 0; j < N; ++j)
        {
            A_matr[i][j] = A[i][j];
        }
        b_vec[i] = b[i];
    }
    LUPDecompose(A_matr, N, 0, P);
    LUPSolve(A_matr, P, b_vec, N, res);
    std::vector<double> x;
    x.reserve(N);
    for (size_t i = 0; i < N; ++i)
    {
        free(A_matr[i]);
        x.push_back(res[i]);
    }
    free(A_matr);
    free(b_vec);
    free(P);
    free(res);
    return x;
}